

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void nni_sha1(void *msg,size_t length,uint8_t *digest)

{
  nni_sha1_ctx local_88;
  
  local_88.len = 0;
  local_88.idx = 0;
  local_88.digest[0] = 0x67452301;
  local_88.digest[1] = 0xefcdab89;
  local_88.digest[2] = 0x98badcfe;
  local_88.digest[3] = 0x10325476;
  local_88.digest[4] = 0xc3d2e1f0;
  nni_sha1_update(&local_88,msg,length);
  nni_sha1_final(&local_88,digest);
  return;
}

Assistant:

void
nni_sha1(const void *msg, size_t length, uint8_t digest[20])
{
	nni_sha1_ctx ctx;

	nni_sha1_init(&ctx);
	nni_sha1_update(&ctx, msg, length);
	nni_sha1_final(&ctx, digest);
}